

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::IssueCMP0095Warning(cmInstallTargetGenerator *this,string *unescapedRpath)

{
  cmake *this_00;
  long lVar1;
  ostream *poVar2;
  string *psVar3;
  cmGlobalGenerator *pcVar4;
  PolicyID id;
  ostringstream w;
  string local_1b0;
  undefined1 local_190 [376];
  
  lVar1 = std::__cxx11::string::find((char *)unescapedRpath,0x7a37bc,0);
  if (lVar1 != -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1b0,(cmPolicies *)&DAT_0000005f,id);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"RPATH entries for target \'",0x1a);
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"will not be escaped in the intermediary ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"cmake_install.cmake script.",0x1b);
    pcVar4 = cmGeneratorTarget::GetGlobalGenerator(this->Target);
    this_00 = pcVar4->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_1b0,
                        &(this->super_cmInstallGenerator).Backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::IssueCMP0095Warning(
  const std::string& unescapedRpath)
{
  // Reduce warning noise to cases where used RPATHs may actually be affected
  // by CMP0095. This filter is meant to skip warnings in cases when
  // non-curly-braces syntax (e.g. $ORIGIN) or no keyword is used which has
  // worked already before CMP0095. We intend to issue a warning in all cases
  // with curly-braces syntax, even if the workaround of double-escaping is in
  // place, since we deprecate the need for it with CMP0095.
  const bool potentially_affected(unescapedRpath.find("${") !=
                                  std::string::npos);

  if (potentially_affected) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0095) << "\n";
    w << "RPATH entries for target '" << this->Target->GetName() << "' "
      << "will not be escaped in the intermediary "
      << "cmake_install.cmake script.";
    this->Target->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING, w.str(), this->GetBacktrace());
  }
}